

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::AddSpell(Character *this,short spell)

{
  bool bVar1;
  size_type sVar2;
  Character_Spell local_1e;
  short local_1a;
  Character *pCStack_18;
  short spell_local;
  Character *this_local;
  
  if ((0 < spell) &&
     (local_1a = spell, pCStack_18 = this,
     sVar2 = std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::size
                       (&this->world->esf->data), (ulong)(long)spell < sVar2)) {
    bVar1 = HasSpell(this,local_1a);
    if (!bVar1) {
      Character_Spell::Character_Spell(&local_1e,local_1a,'\0');
      std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::push_back
                (&this->spells,&local_1e);
      CheckQuestRules(this);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool Character::AddSpell(short spell)
{
	if (spell <= 0 || std::size_t(spell) >= this->world->esf->data.size())
		return false;

	if (this->HasSpell(spell))
		return false;

	this->spells.push_back(Character_Spell(spell, 0));

	this->CheckQuestRules();

	return true;
}